

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MathFunctions.h
# Opt level: O2

int Assimp::Math::gcd<int>(int a,int b)

{
  int iVar1;
  
  for (; (iVar1 = b, a != 0 && (b = b % a, iVar1 = a, b != 0)); a = a % b) {
  }
  return iVar1;
}

Assistant:

inline
IntegerType gcd( IntegerType a, IntegerType b ) {
	const IntegerType zero = (IntegerType)0;
	while ( true ) {
		if ( a == zero )
			return b;
		b %= a;

		if ( b == zero )
			return a;
		a %= b;
	}
}